

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeVisitor.cpp
# Opt level: O1

void __thiscall OpenMD::CompositeVisitor::update(CompositeVisitor *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  p_Var2 = (this->visitorList).
           super__List_base<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while( true ) {
    if (p_Var2 == (_List_node_base *)&this->visitorList) {
      p_Var1 = (_List_node_base *)0x0;
    }
    else {
      p_Var1 = p_Var2[1]._M_next;
    }
    if (p_Var1 == (_List_node_base *)0x0) break;
    (**(code **)((long)p_Var1->_M_next + 0x48))();
    p_Var2 = p_Var2->_M_next;
  }
  return;
}

Assistant:

void CompositeVisitor::update() {
    VisitorIterator i;
    BaseVisitor* curVisitor;

    for (curVisitor = beginVisitor(i); curVisitor; curVisitor = nextVisitor(i))
      curVisitor->update();
  }